

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

Delay3Syntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::Delay3Syntax,slang::syntax::Delay3Syntax_const&>
          (BumpAllocator *this,Delay3Syntax *args)

{
  undefined4 uVar1;
  Delay3Syntax *pDVar2;
  long lVar3;
  Delay3Syntax *pDVar4;
  byte bVar5;
  
  bVar5 = 0;
  pDVar2 = (Delay3Syntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((Delay3Syntax *)this->endPtr < pDVar2 + 1) {
    pDVar2 = (Delay3Syntax *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pDVar2 + 1);
  }
  pDVar4 = pDVar2;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_TimingControlSyntax).super_SyntaxNode.field_0x4;
    (pDVar4->super_TimingControlSyntax).super_SyntaxNode.kind =
         (args->super_TimingControlSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pDVar4->super_TimingControlSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (Delay3Syntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pDVar4 = (Delay3Syntax *)((long)pDVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pDVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }